

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_hal.cpp
# Opt level: O2

MPP_RET mpp_hal_flush(MppHal ctx)

{
  code *UNRECOVERED_JUMPTABLE;
  MPP_RET MVar1;
  
  if (ctx == (MppHal)0x0) {
    _mpp_log_l(2,"mpp_hal","found NULL input\n","mpp_hal_flush");
    return MPP_ERR_NULL_PTR;
  }
  if ((*(long *)((long)ctx + 8) != 0) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)((long)ctx + 8) + 0x48),
     UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    MVar1 = (*UNRECOVERED_JUMPTABLE)(*ctx);
    return MVar1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_hal_flush(MppHal ctx)
{
    if (NULL == ctx) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppHalImpl *p = (MppHalImpl*)ctx;

    if (NULL == p->api || NULL == p->api->flush)
        return MPP_OK;

    return p->api->flush(p->ctx);
}